

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HydroCmd.cpp
# Opt level: O1

void exchange(char **argv,custom_getopt_data *d)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  
  iVar2 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
  iVar3 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6;
  iVar4 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
  if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 <
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 &&
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 <
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0) {
    do {
      uVar6 = iVar4 - _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7;
      uVar5 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 - iVar3;
      if ((int)uVar5 < (int)uVar6) {
        if (0 < (int)uVar5) {
          uVar7 = 0;
          do {
            pcVar1 = argv[(long)iVar3 + uVar7];
            argv[(long)iVar3 + uVar7] = argv[(long)(int)(iVar4 - uVar5) + uVar7];
            argv[(long)(int)(iVar4 - uVar5) + uVar7] = pcVar1;
            uVar7 = uVar7 + 1;
          } while (uVar5 != uVar7);
        }
        iVar4 = iVar4 - uVar5;
      }
      else {
        if (0 < (int)uVar6) {
          uVar7 = 0;
          do {
            pcVar1 = argv[(long)iVar3 + uVar7];
            argv[(long)iVar3 + uVar7] =
                 argv[(long)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 + uVar7];
            argv[(long)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 + uVar7] = pcVar1;
            uVar7 = uVar7 + 1;
          } while (uVar6 != uVar7);
        }
        iVar3 = iVar3 + uVar6;
      }
    } while ((_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 < iVar4) &&
            (iVar3 < _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7));
  }
  _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 =
       (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 -
       _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7) + iVar2;
  _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 = iVar2;
  return;
}

Assistant:

static void exchange(char **argv, struct custom_getopt_data *d)
{
	int bottom = d->first_nonopt;
	int middle = d->last_nonopt;
	int top = d->custom_optind;
	char *tem;

	/*
	 * Exchange the shorter segment with the far end of the longer segment.
	 * That puts the shorter segment into the right place.  It leaves the
	 * longer segment in the right place overall, but it consists of two
	 * parts that need to be swapped next.
	 */
	while (top > middle && middle > bottom) {
		if (top - middle > middle - bottom) {
			/* Bottom segment is the short one.  */
			int len = middle - bottom;
			int i;

			/* Swap it with the top part of the top segment.  */
			for (i = 0; i < len; i++) {
				tem = argv[bottom + i];
				argv[bottom + i] =
					argv[top - (middle - bottom) + i];
				argv[top - (middle - bottom) + i] = tem;
			}
			/* Exclude the moved bottom segment from further swapping.  */
			top -= len;
		} else {
			/* Top segment is the short one.  */
			int len = top - middle;
			int i;

			/* Swap it with the bottom part of the bottom segment.  */
			for (i = 0; i < len; i++) {
				tem = argv[bottom + i];
				argv[bottom + i] = argv[middle + i];
				argv[middle + i] = tem;
			}
			/* Exclude the moved top segment from further swapping.  */
			bottom += len;
		}
	}
	/* Update records for the slots the non-options now occupy.  */
	d->first_nonopt += (d->custom_optind - d->last_nonopt);
	d->last_nonopt = d->custom_optind;
}